

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_123::AsyncPipe::abortRead(AsyncPipe *this)

{
  RefOrVoid<kj::AsyncCapabilityStream> other;
  PromiseFulfiller<void> *pPVar1;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_78;
  undefined1 local_61;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_60;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *f;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_f296;
  Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead,_std::nullptr_t> local_40;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> local_30;
  AsyncCapabilityStream *local_20;
  AsyncCapabilityStream *s;
  AsyncCapabilityStream *_s289;
  AsyncPipe *this_local;
  
  _s289 = &this->super_AsyncCapabilityStream;
  local_20 = kj::_::readMaybe<kj::AsyncCapabilityStream>(&this->state);
  s = local_20;
  if (local_20 == (AsyncCapabilityStream *)0x0) {
    heap<kj::(anonymous_namespace)::AsyncPipe::AbortedRead>();
    Own<kj::AsyncCapabilityStream,decltype(nullptr)>::
    Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead,void>
              ((Own<kj::AsyncCapabilityStream,decltype(nullptr)> *)&local_30,&local_40);
    Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator=(&this->ownState,&local_30);
    Own<kj::AsyncCapabilityStream,_std::nullptr_t>::~Own(&local_30);
    Own<kj::(anonymous_namespace)::AsyncPipe::AbortedRead,_std::nullptr_t>::~Own(&local_40);
    other = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator*(&this->ownState);
    Maybe<kj::AsyncCapabilityStream_&>::operator=(&this->state,other);
    this->readAborted = true;
    local_60 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>
                         (&this->readAbortFulfiller);
    if (local_60 != (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
      f = local_60;
      pPVar1 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(local_60);
      (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_61);
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe();
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
                (&this->readAbortFulfiller,&local_78);
      Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_78);
    }
  }
  else {
    (*(local_20->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[7])();
  }
  return;
}

Assistant:

void abortRead() override {
    KJ_IF_SOME(s, state) {
      s.abortRead();
    } else {
      ownState = kj::heap<AbortedRead>();
      state = *ownState;

      readAborted = true;
      KJ_IF_SOME(f, readAbortFulfiller) {
        f->fulfill();
        readAbortFulfiller = kj::none;
      }
    }